

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_application_info(StateRecorder *this,VkApplicationInfo *info)

{
  Hash HVar1;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> lock;
  string local_40;
  VkApplicationInfo *local_20;
  VkApplicationInfo *info_local;
  StateRecorder *this_local;
  
  local_20 = info;
  info_local = (VkApplicationInfo *)this;
  if (info->pNext == (void *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_50,&this->impl->record_lock);
    this_local._7_1_ =
         Impl::copy_application_info
                   (this->impl,local_20,&this->impl->allocator,&this->impl->application_info);
    if ((bool)this_local._7_1_) {
      HVar1 = Hashing::compute_hash_application_info(this->impl->application_info);
      (this->impl->application_feature_hash).application_info_hash = HVar1;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"pNext in VkApplicationInfo not supported.",
               (allocator *)((long)&lock._M_device + 7));
    log_error_pnext_chain(&local_40,local_20->pNext);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lock._M_device + 7));
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_application_info(const VkApplicationInfo &info)
{
	if (info.pNext)
	{
		log_error_pnext_chain("pNext in VkApplicationInfo not supported.", info.pNext);
		return false;
	}

	std::lock_guard<std::mutex> lock(impl->record_lock);
	if (!impl->copy_application_info(&info, impl->allocator, &impl->application_info))
		return false;
	impl->application_feature_hash.application_info_hash = Hashing::compute_hash_application_info(*impl->application_info);
	return true;
}